

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O0

QTextDocument * qvariant_cast<QTextDocument*>(QVariant *v)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  QTextDocument **ppQVar4;
  QMetaType *pQVar5;
  void *pvVar6;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QTextDocument *t;
  QMetaType targetType;
  QMetaType *in_stack_ffffffffffffffb8;
  Private *in_stack_ffffffffffffffc0;
  QTextDocument *local_30;
  QTextDocument *local_20;
  QMetaTypeInterface *local_18;
  QMetaTypeInterface *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = (QMetaTypeInterface *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = (QMetaTypeInterface *)QMetaType::fromType<QTextDocument*>();
  local_18 = (QMetaTypeInterface *)QVariant::Private::type(in_stack_ffffffffffffffc0);
  bVar1 = operator==((QMetaType *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (bVar1) {
    if ((in_RDI[3] & 1) == 0) {
      local_30 = (QTextDocument *)*in_RDI;
    }
    else {
      iVar2 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x79c9f7);
      if (iVar2 == 1) {
        puVar3 = (undefined8 *)QVariant::PrivateShared::data((PrivateShared *)*in_RDI);
        local_30 = (QTextDocument *)*puVar3;
      }
      else {
        ppQVar4 = QVariant::Private::get<QTextDocument*>((Private *)0x79ca1d);
        local_30 = *ppQVar4;
      }
    }
  }
  else {
    local_20 = (QTextDocument *)0x0;
    pQVar5 = (QMetaType *)QVariant::metaType();
    pvVar6 = QVariant::constData((QVariant *)0x79ca49);
    QMetaType::convert(pQVar5,pvVar6,(QMetaType *)local_10,&local_20);
    local_30 = local_20;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

inline T qvariant_cast(QVariant &&v)
{
    QMetaType targetType = QMetaType::fromType<T>();
    if (v.d.type() == targetType) {
        if (!v.d.is_shared) {
            return std::move(*reinterpret_cast<T *>(v.d.data.data));
        } else {
            if (v.d.data.shared->ref.loadRelaxed() == 1)
                return std::move(*reinterpret_cast<T *>(v.d.data.shared->data()));
            else
                return v.d.get<T>();
        }
    }
    if constexpr (std::is_same_v<T, QVariant>) {
        // if the metatype doesn't match, but we want a QVariant, just return the current variant
        return v;
    } if constexpr (std::is_same_v<T,std::remove_const_t<std::remove_pointer_t<T>> const *>) {
        // moving a pointer is pointless, just do the same as the const & overload
        using nonConstT = std::remove_const_t<std::remove_pointer_t<T>> *;
        QMetaType nonConstTargetType = QMetaType::fromType<nonConstT>();
        if (v.d.type() == nonConstTargetType)
            return v.d.get<nonConstT>();
    }

    T t{};
    QMetaType::convert(v.metaType(), v.constData(), targetType, &t);
    return t;
}